

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split-options.cpp
# Opt level: O0

set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *
wasm::anon_unknown_11::parseNameList
          (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
           *__return_storage_ptr__,string *listOrFile)

{
  ulong uVar1;
  char *pcVar2;
  string local_38;
  string *local_18;
  string *listOrFile_local;
  
  local_18 = listOrFile;
  listOrFile_local = (string *)__return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  if (((uVar1 & 1) == 0) &&
     (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18), *pcVar2 == '@')) {
    std::__cxx11::string::substr((ulong)&local_38,(ulong)local_18);
    parseNameListFromFile(__return_storage_ptr__,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    return __return_storage_ptr__;
  }
  parseNameListFromLine(__return_storage_ptr__,local_18);
  return __return_storage_ptr__;
}

Assistant:

std::set<Name> parseNameList(const std::string& listOrFile) {
  if (!listOrFile.empty() && listOrFile[0] == '@') {
    return parseNameListFromFile(listOrFile.substr(1));
  }

  return parseNameListFromLine(listOrFile);
}